

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::proximate(path *p,path *base)

{
  path *in_RDI;
  path *in_stack_ffffffffffffffd0;
  path *in_stack_ffffffffffffffd8;
  path *p_00;
  
  p_00 = in_RDI;
  weakly_canonical(in_RDI);
  weakly_canonical(p_00);
  path::lexically_proximate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  path::~path((path *)0x2901de);
  path::~path((path *)0x2901e8);
  return in_RDI;
}

Assistant:

GHC_INLINE path proximate(const path& p, const path& base)
{
    return weakly_canonical(p).lexically_proximate(weakly_canonical(base));
}